

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::EnumDescriptorProto::ByteSizeLong(EnumDescriptorProto *this)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *in_RDI;
  int cached_size;
  int n;
  int i;
  EnumDescriptorProto_EnumReservedRange *msg_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *__range2_1;
  EnumValueDescriptorProto *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *__range2;
  uint32 cached_has_bits;
  size_t total_size;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar5;
  reference in_stack_ffffffffffffff80;
  iterator local_78;
  RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto_EnumReservedRange> local_70;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *local_68;
  reference local_60;
  iterator local_58;
  RepeatedPtrIterator<const_google::protobuf::EnumValueDescriptorProto> local_50;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *local_48;
  uint local_3c;
  size_t local_38;
  size_t local_28;
  int *local_20;
  undefined4 local_14;
  Rep **local_10;
  int *local_8;
  
  local_38 = 0;
  local_3c = 0;
  iVar3 = _internal_value_size((EnumDescriptorProto *)0x6866cb);
  local_38 = (long)iVar3 + local_38;
  local_48 = in_RDI + 1;
  local_50.it_ = (void **)RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::begin
                                    (in_RDI);
  local_58.it_ = (void **)RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::end
                                    ((RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *
                                     )CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
  ;
  while (bVar2 = internal::RepeatedPtrIterator<const_google::protobuf::EnumValueDescriptorProto>::
                 operator!=(&local_50,&local_58), bVar2) {
    local_60 = internal::RepeatedPtrIterator<const_google::protobuf::EnumValueDescriptorProto>::
               operator*(&local_50);
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::EnumValueDescriptorProto>
                      ((EnumValueDescriptorProto *)0x686737);
    local_38 = sVar4 + local_38;
    internal::RepeatedPtrIterator<const_google::protobuf::EnumValueDescriptorProto>::operator++
              (&local_50);
  }
  iVar3 = _internal_reserved_range_size((EnumDescriptorProto *)0x686756);
  local_38 = (long)iVar3 + local_38;
  local_68 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *)in_RDI + 2
  ;
  local_70.it_ = (void **)RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                          ::begin((RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                                   *)in_RDI);
  local_78.it_ = (void **)RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                          ::end((RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                                 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while (bVar2 = internal::
                 RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto_EnumReservedRange>
                 ::operator!=(&local_70,&local_78), bVar2) {
    in_stack_ffffffffffffff80 =
         internal::
         RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto_EnumReservedRange>::
         operator*(&local_70);
    sVar4 = internal::WireFormatLite::
            MessageSize<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                      ((EnumDescriptorProto_EnumReservedRange *)0x6867c2);
    local_38 = sVar4 + local_38;
    internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto_EnumReservedRange>::
    operator++(&local_70);
  }
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x6867e5);
  sVar4 = internal::FromIntSize(iVar3);
  local_38 = sVar4 + local_38;
  iVar5 = 0;
  iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x68680f);
  for (; iVar5 < iVar3; iVar5 = iVar5 + 1) {
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Get((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
          (int)((ulong)in_RDI >> 0x20));
    sVar4 = internal::WireFormatLite::StringSize((string *)0x686836);
    local_38 = sVar4 + local_38;
  }
  local_10 = &(((RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *)in_RDI)
              ->super_RepeatedPtrFieldBase).rep_;
  local_14 = 0;
  local_3c = *(uint *)local_10;
  if ((local_3c & 3) != 0) {
    if ((local_3c & 1) != 0) {
      _internal_name_abi_cxx11_((EnumDescriptorProto *)0x6868a0);
      sVar4 = internal::WireFormatLite::StringSize((string *)0x6868a8);
      local_38 = sVar4 + 1 + local_38;
    }
    if ((local_3c & 2) != 0) {
      sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::EnumOptions>
                        ((EnumOptions *)0x6868cf);
      local_38 = sVar4 + 1 + local_38;
    }
  }
  local_20 = &(((RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *)in_RDI)
              ->super_RepeatedPtrFieldBase).current_size_;
  uVar1 = (((RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *)in_RDI)->
          super_RepeatedPtrFieldBase).current_size_;
  local_8 = local_20;
  if ((uVar1 & 1) == 1) {
    local_28 = internal::ComputeUnknownFieldsSize
                         ((InternalMetadataWithArena *)in_stack_ffffffffffffff80,
                          CONCAT44(iVar5,iVar3),
                          (CachedSize *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  else {
    iVar3 = internal::ToCachedSize(local_38);
    SetCachedSize((EnumDescriptorProto *)CONCAT44(iVar3,in_stack_ffffffffffffff70),
                  (int)((ulong)in_RDI >> 0x20));
    local_28 = local_38;
  }
  return local_28;
}

Assistant:

size_t EnumDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.EnumDescriptorProto)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
  total_size += 1UL * this->_internal_value_size();
  for (const auto& msg : this->value_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .google.protobuf.EnumDescriptorProto.EnumReservedRange reserved_range = 4;
  total_size += 1UL * this->_internal_reserved_range_size();
  for (const auto& msg : this->reserved_range_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated string reserved_name = 5;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(reserved_name_.size());
  for (int i = 0, n = reserved_name_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      reserved_name_.Get(i));
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional .google.protobuf.EnumOptions options = 3;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}